

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineMemory.cpp
# Opt level: O3

void Diligent::SetRawAllocator(IMemoryAllocator *pRawAllocator)

{
  string _msg;
  string local_30;
  
  if (pRawAllocator == (IMemoryAllocator *)0x0) {
    FormatString<char[65]>
              (&local_30,
               (char (*) [65])"User-defined allocator is not provided. Using default allocator.");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_30._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    pRawAllocator = &DefaultRawMemoryAllocator::GetAllocator()->super_IMemoryAllocator;
  }
  if (g_pRawAllocator != pRawAllocator && g_pRawAllocator != (IMemoryAllocator *)0x0) {
    FormatString<char[126]>
              (&local_30,
               (char (*) [126])
               "User-defined allocator has already been provided and does not match the new allocator. This may result in undefined behavior."
              );
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"SetRawAllocator",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/EngineMemory.cpp"
               ,0x33);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  g_pRawAllocator = pRawAllocator;
  return;
}

Assistant:

void SetRawAllocator(IMemoryAllocator* pRawAllocator)
{
    if (pRawAllocator == nullptr)
    {
        LOG_INFO_MESSAGE("User-defined allocator is not provided. Using default allocator.");
        pRawAllocator = &DefaultRawMemoryAllocator::GetAllocator();
    }

    DEV_CHECK_ERR(g_pRawAllocator == nullptr || g_pRawAllocator == pRawAllocator,
                  "User-defined allocator has already been provided and does not match the new allocator. "
                  "This may result in undefined behavior.");

    g_pRawAllocator = pRawAllocator;
}